

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::SetStringGap(JSONStringifier *this,JavascriptString *spaceString)

{
  uint uVar1;
  char16 *dest;
  uint *puVar2;
  Recycler *pRVar3;
  char16_t *pcVar4;
  char16 *src;
  TrackAllocData local_48;
  charcount_t local_1c;
  JavascriptString *local_18;
  JavascriptString *spaceString_local;
  JSONStringifier *this_local;
  
  local_18 = spaceString;
  spaceString_local = (JavascriptString *)this;
  local_1c = JavascriptString::GetLength(spaceString);
  puVar2 = min<unsigned_int>(&MaxGapLength,&local_1c);
  this->gapLength = *puVar2;
  if (this->gapLength != 0) {
    pRVar3 = ScriptContext::GetRecycler(this->scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&char16_t::typeinfo,0,(ulong)this->gapLength,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
               ,0x1e);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_48);
    pcVar4 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)this->gapLength);
    this->gap = pcVar4;
    dest = this->gap;
    uVar1 = this->gapLength;
    src = JavascriptString::GetString(local_18);
    wmemcpy_s(dest,(ulong)uVar1,src,(ulong)this->gapLength);
  }
  return;
}

Assistant:

void
JSONStringifier::SetStringGap(_In_ JavascriptString* spaceString)
{
    this->gapLength = min(MaxGapLength, spaceString->GetLength());
    if (this->gapLength != 0)
    {
        this->gap = RecyclerNewArrayLeaf(this->scriptContext->GetRecycler(), char16, this->gapLength);
        wmemcpy_s(gap, this->gapLength, spaceString->GetString(), this->gapLength);
    }
}